

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

bool __thiscall ON_wString::IsValidIntegerNumber(ON_wString *this)

{
  uint uVar1;
  wchar_t __wc;
  wchar_t *pwVar2;
  bool bVar3;
  int iVar4;
  ON_Internal_Empty_wString *pOVar5;
  byte bVar6;
  bool bVar7;
  ulong uVar8;
  
  pwVar2 = this->m_s;
  pOVar5 = &empty_wstring;
  if (pwVar2 != (wchar_t *)0x0) {
    pOVar5 = (ON_Internal_Empty_wString *)(pwVar2 + -3);
  }
  uVar1 = (pOVar5->header).string_length;
  if ((ulong)uVar1 == 0) {
LAB_00677462:
    bVar7 = false;
  }
  else {
    if (0 < (int)uVar1) {
      bVar6 = 1;
      uVar8 = 0;
      bVar7 = false;
      do {
        __wc = pwVar2[uVar8];
        iVar4 = iswspace(__wc);
        if (iVar4 == 0) {
          iVar4 = iswdigit(__wc);
          if (((iVar4 == 0) && (__wc != L'-')) && (__wc != L'+')) goto LAB_00677462;
          bVar6 = 0;
          bVar3 = false;
          if (bVar7) {
            return false;
          }
        }
        else {
          bVar3 = (bool)(bVar6 ^ 1 | bVar7);
        }
        bVar7 = bVar3;
        uVar8 = uVar8 + 1;
      } while (uVar1 != uVar8);
    }
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

ON_wStringHeader* ON_wString::Header() const
{
  ON_wStringHeader* hdr = (ON_wStringHeader*)m_s;
  if (hdr)
    hdr--;
  else
    hdr = &empty_wstring.header;
  return hdr;
}